

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall
SVGChart::BarDataDrawer::DrawOnlyLastPoint
          (BarDataDrawer *this,PlotDataBase *inXData,PlotDataBase *inYData,
          PlotDataSelection *inPlotDataSelection,AxisSetup *inXAxisSetup,PRect *inRect,
          Painter *inPainter)

{
  int iVar1;
  long lVar2;
  Trafo *pTVar3;
  ulong uVar4;
  long lVar5;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  long theI;
  int theHeight;
  int theWidth;
  int theTop;
  int theLeft;
  int theTraY0;
  int theTraY;
  PRect theRect;
  PRect *inRect_local;
  AxisSetup *inXAxisSetup_local;
  PlotDataSelection *inPlotDataSelection_local;
  PlotDataBase *inYData_local;
  PlotDataBase *inXData_local;
  BarDataDrawer *this_local;
  
  uVar4 = inRect->mW / (long)(this->super_DataDrawerBase).mPlotCount;
  lVar2 = inRect->mX;
  iVar1 = (this->super_DataDrawerBase).mPlotIndex;
  (*((this->super_DataDrawerBase).mYTrafo)->_vptr_Trafo[2])(0);
  lVar5 = PlotDataBase::GetSize(inXData);
  if (-1 < lVar5 + -1) {
    pTVar3 = (this->super_DataDrawerBase).mYTrafo;
    PlotDataBase::GetValue(inYData,lVar5 + -1);
    (*pTVar3->_vptr_Trafo[2])();
    (*inPainter->_vptr_Painter[1])
              (inPainter,lVar2 + (long)iVar1 * uVar4 & 0xffffffff,
               (ulong)(uint)(int)extraout_XMM0_Da_00,uVar4 & 0xffffffff,
               (ulong)(uint)((int)extraout_XMM0_Da - (int)extraout_XMM0_Da_00));
  }
  return true;
}

Assistant:

bool BarDataDrawer::DrawOnlyLastPoint (const PlotDataBase &inXData, const PlotDataBase &inYData, [[maybe_unused]] const PlotDataSelection &inPlotDataSelection, [[maybe_unused]] const AxisSetup &inXAxisSetup, const PRect &inRect, Painter &inPainter) const {

      PRect theRect = inRect;
      theRect.mW = inRect.mW / mPlotCount;
      theRect.mX = inRect.mX + mPlotIndex * theRect.mW;

      int /*theTraX,*/ theTraY;
      int theTraY0 = mYTrafo->Transform (0);

      int theLeft, theTop, theWidth, theHeight;

      theWidth = theRect.mW;
      
      // only draw last point:
      long theI = inXData.GetSize () - 1;
      if (theI >= 0) {
        //theTraX = mXTrafo->Transform (inXData.GetValue (theI));
        theTraY = mYTrafo->Transform (inYData.GetValue (theI));

        theLeft = theRect.mX;
        theTop = theTraY;
        theHeight = theTraY0-theTop;

        inPainter.FillRect (theLeft, theTop, theWidth, theHeight);
      }
      return true;
    }